

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O2

void __thiscall
CaDiCraig::CraigTracer::conclude_unsat
          (CraigTracer *this,ConclusionType conclusion,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  int *piVar1;
  pointer pvVar2;
  unsigned_long uVar3;
  uint8_t uVar4;
  CraigData *result;
  int *l_1;
  int *piVar5;
  int *l;
  uint uVar6;
  ulong uVar7;
  
  if (this->craig_interpolant != (CraigData *)0x0) {
    ::operator_delete(this->craig_interpolant,0x20);
    this->craig_interpolant = (CraigData *)0x0;
  }
  if (conclusion == CONSTRAINT) {
    piVar1 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar5 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
      mark_literal(this,*piVar5);
    }
    result = create_interpolant_for_clause(this,&this->constraint,this->craig_constraint_label);
    uVar7 = (ulong)((long)(proof_chain->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(proof_chain->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    while( true ) {
      uVar7 = uVar7 - 1;
      if ((int)(uint)uVar7 < 0) break;
      uVar6 = (uint)uVar7 & 0x7fffffff;
      pvVar2 = (this->craig_clauses).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (proof_chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar6];
      piVar1 = *(pointer *)
                ((long)&pvVar2[uVar3 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (piVar5 = pvVar2[uVar3 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
        uVar4 = mark_literal(this,*piVar5);
        if (uVar4 != '\0') {
          extend_interpolant_with_resolution
                    (this,result,-*piVar5,
                     (this->craig_interpolants).
                     super__Vector_base<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(proof_chain->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar6] - 1]);
        }
      }
    }
    unmark_all(this);
  }
  else if (conclusion == ASSUMPTIONS) {
    result = (CraigData *)::operator_new(0x20);
    CraigData::CraigData
              (result,(this->craig_interpolants).
                      super__Vector_base<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(proof_chain->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start - 1]);
  }
  else if (conclusion == CONFLICT) {
    result = (CraigData *)::operator_new(0x20);
    CraigData::CraigData
              (result,(this->craig_interpolants).
                      super__Vector_base<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(proof_chain->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start - 1]);
  }
  else {
    result = (CraigData *)0x0;
  }
  this->craig_interpolant = result;
  return;
}

Assistant:

void CraigTracer::conclude_unsat (
    CaDiCaL::ConclusionType conclusion,
    const std::vector<uint64_t> &proof_chain) {
  if (craig_interpolant) {
    delete craig_interpolant;
    craig_interpolant = 0;
  }

  CraigData *interpolant = 0;
  if (conclusion == CaDiCaL::ConclusionType::CONFLICT) {
    // There is a single global conflict.
    // The proof_chain contains a single empty clause.
    // chain = (c1), c1 = {}
    assert (proof_chain.size () == 1);
    assert (craig_clauses[proof_chain[0] - 1].empty ());
    interpolant = new CraigData (*craig_interpolants[proof_chain[0] - 1]);
  } else if (conclusion == CaDiCaL::ConclusionType::ASSUMPTIONS) {
    // One or more constraints are responsible for the conflict.
    // The proof_chain contains a single clause with failing assumptions.
    // The interpolant of that clause already has been resolved with
    // assumption interpolants. chain = (c1), c1 = { -a1, -a2, -a3, ... }
    assert (proof_chain.size () == 1);
    assert (craig_clauses[proof_chain[0] - 1].size () > 0);
    interpolant = new CraigData (*craig_interpolants[proof_chain[0] - 1]);
  } else if (conclusion == CaDiCaL::ConclusionType::CONSTRAINT) {
    // The constraint clause is responsible for the conflict.

    // Mark literals of conflicting clause.
    for (auto &l : constraint)
      mark_literal (l);

    // Find pivot literal of each clause that was resolved with
    // and extend Craig interpolant for it.
    interpolant =
        create_interpolant_for_clause (constraint, craig_constraint_label);
    for (int i = proof_chain.size () - 1; i >= 0; i--) {
      for (auto &l : craig_clauses[proof_chain[i] - 1]) {
        // Function mark_literal returns true if inverse literal was marked
        // before and marks literal l for the following resolvent literal
        // checks.
        if (!mark_literal (l))
          continue;

        extend_interpolant_with_resolution (
            *interpolant, -l, *craig_interpolants[proof_chain[i] - 1]);
      }
    }

    unmark_all ();
  } else {
    assert (false); // No conclusion given!
  }

  craig_interpolant = interpolant;
}